

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall HighsSymmetryDetection::partitionRefinement(HighsSymmetryDetection *this)

{
  uint uVar1;
  pointer puVar2;
  pointer piVar3;
  pointer piVar4;
  HighsHashTable<int,_unsigned_int> *pHVar5;
  HighsSymmetryDetection *pHVar6;
  bool bVar7;
  int *piVar8;
  ValueType *pVVar9;
  undefined7 extraout_var;
  int *piVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  pointer piVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_91;
  int local_90;
  int local_8c;
  int local_88;
  uint local_84;
  HighsHashTable<int,_unsigned_int> *local_80;
  long local_78;
  HighsSymmetryDetection *local_70;
  u64 local_68;
  int local_5c;
  ulong local_58;
  long local_50;
  ulong local_48;
  u64 local_40;
  u64 local_38;
  
  piVar10 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar8 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar19 = piVar10 == piVar8;
  if (!bVar19) {
    local_80 = &this->vertexHash;
    local_70 = this;
    do {
      if (4 < (long)piVar8 - (long)piVar10) {
        iVar16 = piVar8[-1];
        piVar8[-1] = *piVar10;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                  (piVar10,0,(long)piVar8 + (-4 - (long)piVar10) >> 2,iVar16);
      }
      pHVar5 = local_80;
      puVar2 = (this->cellInRefinementQueue).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_88 = piVar14[-1];
      local_50 = (long)local_88;
      (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar14 + -1;
      puVar2[local_50] = '\0';
      iVar16 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_50];
      if (iVar16 - local_88 != 1) {
        lVar17 = (long)iVar16;
        piVar3 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar14 = piVar3 + local_50;
        local_90 = iVar16;
        if (iVar16 != local_88) {
          piVar10 = piVar3 + lVar17;
          piVar8 = piVar14;
          do {
            while( true ) {
              piVar14 = piVar8;
              local_8c = *piVar14;
              bVar7 = HighsHashTable<int,_unsigned_int>::findPosition
                                (pHVar5,&local_8c,&local_91,&local_38,&local_40,&local_68);
              if (bVar7) break;
              piVar14 = piVar14 + 1;
              piVar8 = piVar14;
              if (piVar14 == piVar10) goto LAB_002ffffb;
            }
            do {
              piVar10 = piVar10 + -1;
              if (piVar10 == piVar14) goto LAB_002ffffb;
              local_8c = *piVar10;
              bVar7 = HighsHashTable<int,_unsigned_int>::findPosition
                                (pHVar5,&local_8c,&local_91,&local_38,&local_40,&local_68);
            } while (bVar7);
            iVar16 = *piVar14;
            *piVar14 = *piVar10;
            *piVar10 = iVar16;
            piVar8 = piVar14 + 1;
          } while (piVar10 != piVar14 + 1);
          piVar14 = piVar14 + 1;
        }
LAB_002ffffb:
        pHVar5 = local_80;
        iVar16 = local_88;
        piVar3 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_58 = (ulong)((long)piVar14 - (long)piVar3) >> 2;
        iVar18 = (int)local_58;
        if (local_90 != iVar18) {
          lVar15 = ((long)piVar14 - (long)piVar3) * 0x40000000 >> 0x1e;
          lVar12 = lVar17 * 4 - lVar15;
          local_78 = lVar17;
          if (lVar12 != 0) {
            uVar13 = lVar12 >> 2;
            iVar11 = 0;
            if (1 < uVar13) {
              iVar11 = 0;
              do {
                uVar13 = (long)uVar13 >> 1;
                iVar11 = iVar11 + 1;
              } while (1 < uVar13);
            }
            pdqsort_detail::
            pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1,false>
                      ((int *)(lVar15 + (long)piVar3),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (piVar3 + lVar17),(anon_class_8_1_8991fb9c)this,iVar11,true);
          }
          iVar11 = local_90;
          if (iVar16 != iVar18) {
            bVar7 = splitCell(this,iVar16,iVar18);
            if (!bVar7) {
              piVar8 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              for (piVar10 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start; piVar10 != piVar8;
                  piVar10 = piVar10 + 1) {
                (this->cellInRefinementQueue).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar10] = '\0';
              }
              piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar14) {
                (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar14;
              }
              break;
            }
            updateCellMembership(this,iVar18,iVar18,true);
            iVar16 = iVar18;
          }
          lVar17 = (long)iVar16;
          pVVar9 = HighsHashTable<int,_unsigned_int>::operator[]
                             (pHVar5,(this->currentPartition).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar17);
          local_48 = (ulong)*pVVar9;
          local_5c = iVar16 + 1;
          if (iVar16 + 1 < iVar11) {
            local_5c = iVar11;
          }
          local_5c = local_5c + -1;
          iVar18 = iVar16 + -1;
          local_84 = 0;
          do {
            pHVar6 = local_70;
            lVar17 = lVar17 + 1;
            iVar11 = local_5c;
            if (local_78 <= lVar17) break;
            local_68._0_4_ =
                 (local_70->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17];
            pVVar9 = HighsHashTable<int,_unsigned_int>::operator[]
                               (local_80,(KeyType_conflict *)&local_68);
            uVar1 = *pVVar9;
            uVar13 = local_48;
            iVar11 = iVar16;
            if (local_48 == uVar1) {
LAB_00300158:
              updateCellMembership(local_70,iVar18 + 2,iVar11,true);
              bVar7 = true;
              local_48 = uVar13;
              iVar16 = iVar11;
            }
            else {
              bVar7 = splitCell(pHVar6,iVar16,iVar18 + 2);
              uVar13 = (ulong)uVar1;
              iVar11 = iVar18 + 2;
              if (bVar7) goto LAB_00300158;
              local_84 = (uint)CONCAT71(extraout_var,1);
              bVar7 = false;
            }
            iVar18 = iVar18 + 1;
            iVar11 = iVar18;
          } while (bVar7);
          lVar17 = local_50;
          pHVar6 = local_70;
          this = local_70;
          if ((local_84 & 1) != 0) {
            piVar8 = (local_70->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (piVar10 = (local_70->refinementQueue).super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_start; piVar10 != piVar8;
                piVar10 = piVar10 + 1) {
              (local_70->cellInRefinementQueue).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar10] = '\0';
            }
            piVar14 = (local_70->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((local_70->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != piVar14) {
              (local_70->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar14;
            }
            HighsHashTable<int,_unsigned_int>::clear(local_80);
            piVar14 = (pHVar6->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            piVar14[lVar17] = local_90;
            if (iVar11 < (int)local_58) {
              return bVar19;
            }
            piVar3 = (pHVar6->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar4 = (pHVar6->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = (long)iVar11 + 1;
            do {
              iVar16 = piVar3[lVar12 + -1];
              if ((piVar4[iVar16] != local_88) && (piVar4[iVar16] = local_88, lVar12 - lVar17 != 1))
              {
                piVar14[lVar12 + -1] = local_88;
              }
              lVar12 = lVar12 + -1;
            } while ((int)local_58 < lVar12);
            return bVar19;
          }
        }
      }
      piVar10 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar19 = piVar10 == piVar8;
    } while (!bVar19);
  }
  HighsHashTable<int,_unsigned_int>::clear(&this->vertexHash);
  return bVar19;
}

Assistant:

bool HighsSymmetryDetection::partitionRefinement() {
  while (!refinementQueue.empty()) {
    std::pop_heap(refinementQueue.begin(), refinementQueue.end(),
                  std::greater<HighsInt>());

    HighsInt cellStart = refinementQueue.back();
    HighsInt firstCellStart = cellStart;
    refinementQueue.pop_back();
    cellInRefinementQueue[cellStart] = false;

    if (cellSize(cellStart) == 1) continue;
    HighsInt cellEnd = currentPartitionLinks[cellStart];
    assert(cellEnd >= cellStart);

    // first check which vertices do have updated hash values and put them to
    // the end of the partition
    HighsInt refineStart =
        std::partition(
            currentPartition.begin() + cellStart,
            currentPartition.begin() + cellEnd,
            [&](HighsInt v) { return vertexHash.find(v) == nullptr; }) -
        currentPartition.begin();

    // if there are none there is nothing to refine
    if (refineStart == cellEnd) continue;

    // sort the vertices that have updated hash values by their hash values
    pdqsort(currentPartition.begin() + refineStart,
            currentPartition.begin() + cellEnd, [&](HighsInt v1, HighsInt v2) {
              return vertexHash[v1] < vertexHash[v2];
            });

    // if not all vertices have updated hash values directly create the first
    // new cell at the start of the range that we want to refine
    if (refineStart != cellStart) {
      assert(refineStart != cellStart);
      assert(refineStart != cellEnd);
      if (!splitCell(cellStart, refineStart)) {
        // node can be pruned, make sure hash values are cleared and queue is
        // empty
        for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
        refinementQueue.clear();
        vertexHash.clear();
        return false;
      }
      cellStart = refineStart;
      updateCellMembership(cellStart, cellStart);
    }

    // now update the remaining vertices
    bool prune = false;
    HighsInt i;
    assert(vertexHash.find(currentPartition[cellStart]) != nullptr);
    // store value of first hash
    u64 lastHash = vertexHash[currentPartition[cellStart]];
    for (i = cellStart + 1; i < cellEnd; ++i) {
      HighsInt vertex = currentPartition[i];
      // get this vertex hash value
      u64 hash = vertexHash[vertex];

      if (hash != lastHash) {
        // hash values do not match -> start of new cell
        if (!splitCell(cellStart, i)) {
          // refinement process yielded bad prefix of certificate
          // -> node can be pruned
          prune = true;
          break;
        }
        cellStart = i;
        // remember hash value of this new cell under lastHash
        lastHash = hash;
      }

      // update membership of vertex to new cell
      updateCellMembership(i, cellStart);
    }

    if (prune) {
      // node can be pruned, make sure hash values are cleared and queue is
      // empty
      for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
      refinementQueue.clear();
      vertexHash.clear();
      currentPartitionLinks[firstCellStart] = cellEnd;

      // undo possibly incomplete changes done to the cells
      for (--i; i >= refineStart; --i)
        updateCellMembership(i, firstCellStart, false);

      return false;
    }

    assert(currentPartitionLinks[cellStart] == cellEnd);
  }

  vertexHash.clear();

  return true;
}